

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::Clipper::FixupFirstLefts1(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long lVar3;
  OutPt *op_00;
  int iVar4;
  long lVar5;
  OutRec *pOVar6;
  ulong uVar7;
  OutPt *op;
  long lVar8;
  byte unaff_R15B;
  byte bVar9;
  
  pp_Var1 = this->_vptr_Clipper;
  p_Var2 = pp_Var1[-3];
  lVar5 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
  if (*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>) != lVar5) {
    uVar7 = 0;
    do {
      lVar5 = *(long *)(lVar5 + uVar7 * 8);
      for (pOVar6 = *(OutRec **)(lVar5 + 8);
          (pOVar6 != (OutRec *)0x0 && (pOVar6->Pts == (OutPt *)0x0)); pOVar6 = pOVar6->FirstLeft) {
      }
      lVar3 = *(long *)(lVar5 + 0x18);
      if (pOVar6 == OldOutRec && lVar3 != 0) {
        op_00 = NewOutRec->Pts;
        lVar8 = lVar3;
        bVar9 = unaff_R15B;
        do {
          iVar4 = PointInPolygon((IntPoint *)(lVar8 + 8),op_00);
          unaff_R15B = iVar4 != 0;
          if (iVar4 < 0) {
            lVar8 = *(long *)(lVar8 + 0x18);
            unaff_R15B = bVar9;
          }
          if (-1 < iVar4) {
            if ((unaff_R15B & 1) == 0) goto LAB_00113c23;
            break;
          }
          bVar9 = unaff_R15B;
        } while (lVar8 != lVar3);
        *(OutRec **)(lVar5 + 8) = NewOutRec;
      }
LAB_00113c23:
      uVar7 = uVar7 + 1;
      p_Var2 = pp_Var1[-3];
      lVar5 = *(long *)((long)&this->m_ClipType + (long)p_Var2);
    } while (uVar7 < (ulong)(*(long *)(p_Var2 + (long)&(this->m_Maxima).
                                                                                                              
                                                  super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar5 >> 3));
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts1(OutRec* OldOutRec, OutRec* NewOutRec)
{ 
  //tests if NewOutRec contains the polygon before reassigning FirstLeft
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts  && firstLeft == OldOutRec)
    {
      if (Poly2ContainsPoly1(outRec->Pts, NewOutRec->Pts))
        outRec->FirstLeft = NewOutRec;
    }
  }
}